

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_tuple_primitive_getType
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t *psVar1;
  ulong uVar2;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  psVar1 = (sysbvm_tuple_t *)*arguments;
  uVar2 = (ulong)psVar1 & 0xf;
  if (uVar2 != 0 || psVar1 == (sysbvm_tuple_t *)0x0) {
    if ((int)uVar2 == 0xf) {
      if ((sysbvm_tuple_t *)0x5f < psVar1) {
        return 0;
      }
      psVar1 = (context->roots).immediateTrivialTypeTable + ((ulong)psVar1 >> 4);
    }
    else {
      psVar1 = (context->roots).immediateTypeTable + uVar2;
    }
  }
  return *psVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_getType(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    return sysbvm_tuple_getType(context, arguments[0]);
}